

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

connectdata * find_oldest_idle_connection_in_bundle(SessionHandle *data,connectbundle *bundle)

{
  SessionHandle *pSVar1;
  timeval older;
  long lVar2;
  SessionHandle *pSVar3;
  long lVar4;
  SessionHandle *pSVar5;
  timeval newer;
  
  newer = curlx_tvnow();
  pSVar3 = data->easy_conn->data;
  if (pSVar3 == (SessionHandle *)0x0) {
    pSVar5 = (SessionHandle *)0x0;
  }
  else {
    lVar4 = -1;
    pSVar5 = (SessionHandle *)0x0;
    do {
      pSVar1 = pSVar3->next;
      if ((*(_Bool *)((long)pSVar1->sockets + 0x10) == false) &&
         (older.tv_sec = (__time_t)(pSVar1->set).err,
         older.tv_usec = (__suseconds_t)(pSVar1->set).debugdata, lVar2 = curlx_tvdiff(newer,older),
         lVar4 < lVar2)) {
        lVar4 = lVar2;
        pSVar5 = pSVar1;
      }
      pSVar3 = (SessionHandle *)pSVar3->easy_conn;
    } while (pSVar3 != (SessionHandle *)0x0);
  }
  return (connectdata *)pSVar5;
}

Assistant:

static struct connectdata *
find_oldest_idle_connection_in_bundle(struct SessionHandle *data,
                                      struct connectbundle *bundle)
{
  struct curl_llist_element *curr;
  long highscore=-1;
  long score;
  struct timeval now;
  struct connectdata *conn_candidate = NULL;
  struct connectdata *conn;

  (void)data;

  now = Curl_tvnow();

  curr = bundle->conn_list->head;
  while(curr) {
    conn = curr->ptr;

    if(!conn->inuse) {
      /* Set higher score for the age passed since the connection was used */
      score = Curl_tvdiff(now, conn->now);

      if(score > highscore) {
        highscore = score;
        conn_candidate = conn;
      }
    }
    curr = curr->next;
  }

  return conn_candidate;
}